

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyplg_ext_insert(lyd_node *parent,lyd_node *first)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  lyd_node *plVar3;
  char *pcVar4;
  lys_module *plVar5;
  
  if (parent == (lyd_node *)0x0) {
    pcVar4 = "parent";
  }
  else if (first == (lyd_node *)0x0) {
    pcVar4 = "first";
  }
  else if (first->parent == (lyd_node_inner *)0x0) {
    if (first->prev->next == (lyd_node *)0x0) {
      plVar1 = parent->schema;
      if ((plVar1 == (lysc_node *)0x0) || ((plVar1->nodetype & 0x711) != 0)) {
        plVar2 = first->schema;
        if ((plVar2 != (lysc_node *)0x0) && ((plVar2->flags & 0x100) != 0)) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar5 = plVar1->module;
          }
          ly_log(plVar5->ctx,LY_LLERR,LY_EINVAL,"Cannot insert key \"%s\".",plVar2->name);
          return LY_EINVAL;
        }
        do {
          plVar3 = first->next;
          lyd_unlink(first);
          lyd_insert_node(parent,(lyd_node **)0x0,first,1);
          first = plVar3;
        } while (plVar3 != (lyd_node *)0x0);
        return LY_SUCCESS;
      }
      pcVar4 = 
      "!parent->schema || (parent->schema->nodetype & (0x0001|0x0010|0x0100|0x0200|0x0400))";
    }
    else {
      pcVar4 = "!first->prev->next";
    }
  }
  else {
    pcVar4 = "!first->parent";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"lyplg_ext_insert");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_insert(struct lyd_node *parent, struct lyd_node *first)
{
    struct lyd_node *iter;

    LY_CHECK_ARG_RET(NULL, parent, first, !first->parent, !first->prev->next,
            !parent->schema || (parent->schema->nodetype & LYD_NODE_INNER), LY_EINVAL);

    if (first->schema && (first->schema->flags & LYS_KEY)) {
        LOGERR(LYD_CTX(parent), LY_EINVAL, "Cannot insert key \"%s\".", first->schema->name);
        return LY_EINVAL;
    }

    while (first) {
        iter = first->next;
        lyd_unlink(first);
        lyd_insert_node(parent, NULL, first, LYD_INSERT_NODE_LAST);
        first = iter;
    }
    return LY_SUCCESS;
}